

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall
QtPrivate::QPropertyBindingData::notifyObservers
          (QPropertyBindingData *this,QUntypedPropertyData *propertyDataPtr,QBindingStorage *storage
          )

{
  void *pvVar1;
  NotificationResult NVar2;
  QPropertyObserverPointer observer;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QPropertyObserverPointer local_858;
  QPropertyBindingDataPointer local_850;
  PendingBindingObserverList local_848;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d_ptr & 2) == 0) {
    local_850.ptr = this;
    memset(&local_848.super_QVLAStorage<8UL,_8UL,_256LL>,0xaa,0x800);
    local_848.super_QVLABase<QPropertyBindingPrivatePtr>.super_QVLABaseBase.a = 0x100;
    local_848.super_QVLABase<QPropertyBindingPrivatePtr>.super_QVLABaseBase.s = 0;
    local_848.super_QVLABase<QPropertyBindingPrivatePtr>.super_QVLABaseBase.ptr =
         &local_848.super_QVLAStorage<8UL,_8UL,_256LL>;
    observer = QPropertyBindingDataPointer::firstObserver(&local_850);
    if (observer.ptr != (QPropertyObserver *)0x0) {
      NVar2 = notifyObserver_helper(this,propertyDataPtr,storage,observer,&local_848);
      if (NVar2 != Delayed) {
        if (storage != (QBindingStorage *)0x0) {
          local_850.ptr = QBindingStorage::bindingData(storage,propertyDataPtr);
        }
        local_858 = QPropertyBindingDataPointer::firstObserver(&local_850);
        if (local_858.ptr != (QPropertyObserver *)0x0) {
          QPropertyObserverPointer::notify(&local_858,propertyDataPtr);
        }
        pvVar1 = local_848.super_QVLABase<QPropertyBindingPrivatePtr>.super_QVLABaseBase.ptr;
        lVar3 = local_848.super_QVLABase<QPropertyBindingPrivatePtr>.super_QVLABaseBase.s << 3;
        for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 8) {
          QPropertyBindingPrivate::notifyNonRecursive
                    (*(QPropertyBindingPrivate **)((char *)pvVar1 + lVar4));
        }
      }
    }
    QVarLengthArray<QPropertyBindingPrivatePtr,_256LL>::~QVarLengthArray(&local_848);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyBindingData::notifyObservers(QUntypedPropertyData *propertyDataPtr, QBindingStorage *storage) const
{
    if (isNotificationDelayed())
        return;
    QPropertyBindingDataPointer d{this};

    PendingBindingObserverList bindingObservers;
    if (QPropertyObserverPointer observer = d.firstObserver()) {
        if (notifyObserver_helper(propertyDataPtr, storage, observer, bindingObservers) == Evaluated) {
            /* evaluateBindings() can trash the observers. We need to re-fetch here.
             "this" might also no longer be valid in case we have a QObjectBindableProperty
             and consequently d isn't either (this happens when binding evaluation has
             caused the binding storage to resize.
             If storage is nullptr, then there is no dynamically resizable storage,
             and we cannot run into the issue.
            */
            if (storage)
                d = QPropertyBindingDataPointer {storage->bindingData(propertyDataPtr)};
            if (QPropertyObserverPointer observer = d.firstObserver())
                observer.notify(propertyDataPtr);
            for (auto &&bindingPtr: bindingObservers) {
                auto *binding = static_cast<QPropertyBindingPrivate *>(bindingPtr.get());
                binding->notifyNonRecursive();
            }
        }
    }
}